

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_state.cc
# Opt level: O3

void __thiscall StateVar::GenSetFunction(StateVar *this,Output *out_h,Env *env)

{
  _Alloc_hider _Var1;
  _Alloc_hider _Var2;
  char *pcVar3;
  string local_68;
  string local_48;
  
  set_function_abi_cxx11_(&local_48,this->id_);
  _Var2._M_p = local_48._M_dataplus._M_p;
  Type::DataTypeConstRefStr_abi_cxx11_(&local_68,this->type_);
  _Var1._M_p = local_68._M_dataplus._M_p;
  pcVar3 = Env::LValue(env,this->id_);
  Output::println(out_h,"void %s(%s x) \t{ %s = x; }",_Var2._M_p,_Var1._M_p,pcVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void StateVar::GenSetFunction(Output* out_h, Env* env)
	{
	out_h->println("void %s(%s x) 	{ %s = x; }", set_function(id_).c_str(),
	               type_->DataTypeConstRefStr().c_str(), env->LValue(id_));
	}